

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
typeCheckValue(UA_Server *server,UA_NodeId *targetDataTypeId,UA_Int32 targetValueRank,
              size_t targetArrayDimensionsSize,UA_UInt32 *targetArrayDimensions,UA_Variant *value,
              UA_NumericRange *range,UA_Variant *editableValue)

{
  byte bVar1;
  short sVar2;
  UA_UInt16 UVar3;
  UA_DataType *pUVar4;
  size_t *psVar5;
  long lVar6;
  byte bVar7;
  void *pvVar8;
  UA_VariantStorageType UVar9;
  undefined4 uVar10;
  UA_Boolean UVar11;
  UA_StatusCode UVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  int iVar16;
  UA_UInt32 *pUVar17;
  int iVar18;
  undefined1 local_78 [8];
  UA_NodeId subtypeId;
  UA_UInt32 tempArrayDimensions;
  
  pUVar4 = value->type;
  if (pUVar4 != (UA_DataType *)0x0) {
    UVar11 = UA_NodeId_equal(&pUVar4->typeId,targetDataTypeId);
    if (!UVar11) {
      local_78._0_2_ = 0;
      stack0xffffffffffffff8c = 0x2d00000000;
      UVar11 = isNodeInTree(server->nodestore,&pUVar4->typeId,targetDataTypeId,(UA_NodeId *)local_78
                            ,1);
      if (!UVar11) {
        if (editableValue == (UA_Variant *)0x0) {
          return 0x80740000;
        }
        lVar15 = 0;
        while (*(UA_UInt32 *)((long)&UA_TYPES[0].typeId.identifier + lVar15) !=
               (targetDataTypeId->identifier).numeric) {
          lVar15 = lVar15 + 0x30;
          if (lVar15 == 0x1e90) {
            return 0x80740000;
          }
        }
        if (((pUVar4 == (UA_DataType *)0x13e650 && lVar15 == 0x60) && (value->arrayLength == 0)) &&
           (psVar5 = (size_t *)value->data, (size_t *)0x1 < psVar5)) {
          editableValue->storageType = UA_VARIANT_DATA_NODELETE;
          editableValue->type = (UA_DataType *)0x13e410;
          editableValue->arrayLength = *psVar5;
          editableValue->data = (void *)psVar5[1];
          value = editableValue;
        }
        else {
          iVar16 = 0;
          bVar7 = 0;
          iVar18 = 0;
          if ((&UA_TYPES[0].membersSize)[lVar15] == '\x01') {
            lVar6 = *(long *)((long)&UA_TYPES[0].members + lVar15);
            bVar1 = *(byte *)(lVar6 + 0xb);
            bVar7 = 0;
            if ((bVar1 & 1) != 0) {
              sVar2 = *(short *)(lVar6 + 8);
              bVar7 = 1;
              if (sVar2 == 5) {
                iVar18 = 1;
              }
              else if ((sVar2 != 2) || (iVar18 = 2, (bVar1 & 2) == 0)) {
                bVar7 = 0;
                iVar18 = 0;
              }
            }
          }
          if (pUVar4->membersSize == '\x01') {
            bVar1 = pUVar4->members->field_0xb;
            if ((bVar1 & 1) != 0) {
              UVar3 = pUVar4->members->memberTypeIndex;
              if (UVar3 == 5) {
                iVar16 = 1;
              }
              else if ((UVar3 != 2) || (iVar16 = 2, (bVar1 & 2) == 0)) {
                iVar16 = 0;
              }
            }
          }
          if ((bool)(bVar7 ^ 1 | iVar18 != iVar16)) {
            return 0x80740000;
          }
          UVar9 = value->storageType;
          uVar10 = *(undefined4 *)&value->field_0xc;
          sVar14 = value->arrayLength;
          pvVar8 = value->data;
          sVar13 = value->arrayDimensionsSize;
          pUVar17 = value->arrayDimensions;
          editableValue->type = value->type;
          editableValue->storageType = UVar9;
          *(undefined4 *)&editableValue->field_0xc = uVar10;
          editableValue->arrayDimensionsSize = sVar13;
          editableValue->arrayDimensions = pUVar17;
          editableValue->arrayLength = sVar14;
          editableValue->data = pvVar8;
          editableValue->storageType = UA_VARIANT_DATA_NODELETE;
          editableValue->type = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar15);
          value = editableValue;
        }
      }
    }
  }
  UVar12 = 0;
  if (range == (UA_NumericRange *)0x0) {
    sVar14 = value->arrayDimensionsSize;
    pUVar17 = value->arrayDimensions;
    sVar13 = sVar14;
    if (pUVar17 == (UA_UInt32 *)0x0) {
      if ((value->arrayLength == 0) && ((void *)0x1 < value->data)) {
        pUVar17 = (UA_UInt32 *)0x0;
      }
      else {
        pUVar17 = (UA_UInt32 *)((long)&subtypeId.identifier + 0xc);
        subtypeId.identifier._12_4_ = (int)value->arrayLength;
        sVar13 = 1;
      }
    }
    if (targetArrayDimensionsSize == 0) {
      UVar12 = 0;
      if (value->data != (void *)0x0) {
        if (value->arrayLength != 0) {
          sVar14 = 1;
        }
        if (value->data < (void *)0x2) {
          sVar14 = 1;
        }
        UVar12 = compatibleValueRankArrayDimensions(targetValueRank,sVar14);
        return UVar12;
      }
    }
    else {
      UVar12 = 0x80740000;
      if (sVar13 == targetArrayDimensionsSize) {
        sVar14 = 0;
        do {
          if ((targetArrayDimensions[sVar14] != 0) &&
             (targetArrayDimensions[sVar14] != pUVar17[sVar14])) {
            return 0x80740000;
          }
          sVar14 = sVar14 + 1;
        } while (targetArrayDimensionsSize != sVar14);
        UVar12 = 0;
      }
    }
  }
  return UVar12;
}

Assistant:

UA_StatusCode
typeCheckValue(UA_Server *server, const UA_NodeId *targetDataTypeId,
               UA_Int32 targetValueRank, size_t targetArrayDimensionsSize,
               const UA_UInt32 *targetArrayDimensions, const UA_Variant *value,
               const UA_NumericRange *range, UA_Variant *editableValue) {
    /* Empty variant is only allowed for BaseDataType */
    if(!value->type)
        goto check_array;

    /* See if the types match. The nodeid on the wire may be != the nodeid in
     * the node for opaque types, enums and bytestrings. value contains the
     * correct type definition after the following paragraph */
    if(UA_NodeId_equal(&value->type->typeId, targetDataTypeId))
        goto check_array;

    /* Has the value a subtype of the required type? */
    const UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(isNodeInTree(server->nodestore, &value->type->typeId, targetDataTypeId, &subtypeId, 1))
        goto check_array;

    /* Try to convert to a matching value if this is wanted */
    if(!editableValue)
        return UA_STATUSCODE_BADTYPEMISMATCH;
    value = convertToMatchingValue(server, value, targetDataTypeId, editableValue);
    if(!value)
        return UA_STATUSCODE_BADTYPEMISMATCH;

 check_array:
    if(range) /* array dimensions are checked later when writing the range */
        return UA_STATUSCODE_GOOD;

    size_t valueArrayDimensionsSize = value->arrayDimensionsSize;
    UA_UInt32 *valueArrayDimensions = value->arrayDimensions;
    UA_UInt32 tempArrayDimensions;
    if(valueArrayDimensions == 0 && !UA_Variant_isScalar(value)) {
        valueArrayDimensionsSize = 1;
        tempArrayDimensions = (UA_UInt32)value->arrayLength;
        valueArrayDimensions = &tempArrayDimensions;
    }

    /* See if the array dimensions match. When arrayDimensions are defined, they
     * already hold the valuerank. */
    if(targetArrayDimensionsSize > 0)
        return compatibleArrayDimensions(targetArrayDimensionsSize, targetArrayDimensions,
                                         valueArrayDimensionsSize, valueArrayDimensions);

    /* Check if the valuerank allows for the value dimension */
    return compatibleValueRankValue(targetValueRank, value);
}